

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  void *local_108;
  void *pMem;
  char *zFile;
  undefined1 local_f0 [4];
  int iPg;
  stat sStat;
  int nByte;
  char **apNew;
  int rc;
  unixShmNode *pShmNode;
  unixShm *p;
  unixFile *pDbFd;
  void **pp_local;
  int bExtend_local;
  int szRegion_local;
  int iRegion_local;
  sqlite3_file *fd_local;
  
  apNew._4_4_ = 0;
  if ((fd[8].pMethods == (sqlite3_io_methods *)0x0) &&
     (apNew._4_4_ = unixOpenSharedMemory((unixFile *)fd), apNew._4_4_ != 0)) {
    return apNew._4_4_;
  }
  lVar1 = *(long *)fd[8].pMethods;
  sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar1 + 8));
  if ((int)(uint)*(ushort *)(lVar1 + 0x20) <= iRegion) {
    sStat.__glibc_reserved[2]._4_4_ = (iRegion + 1) * szRegion;
    *(int *)(lVar1 + 0x1c) = szRegion;
    if (-1 < *(int *)(lVar1 + 0x18)) {
      iVar2 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),local_f0);
      if (iVar2 != 0) {
        apNew._4_4_ = 0x130a;
        goto LAB_0013f701;
      }
      if ((long)sStat.st_rdev < (long)sStat.__glibc_reserved[2]._4_4_) {
        if (bExtend == 0) goto LAB_0013f701;
        for (zFile._4_4_ = (int)((long)sStat.st_rdev / 0x1000);
            zFile._4_4_ < sStat.__glibc_reserved[2]._4_4_ / 0x1000; zFile._4_4_ = zFile._4_4_ + 1) {
          iVar2 = seekAndWriteFd(*(int *)(lVar1 + 0x18),(long)(zFile._4_4_ * 0x1000 + 0xfff),"",1,
                                 (int *)0x0);
          if (iVar2 != 1) {
            apNew._4_4_ = unixLogErrorAtLine(0x130a,"write",*(char **)(lVar1 + 0x10),0x6b3e);
            goto LAB_0013f701;
          }
        }
      }
    }
    pvVar3 = sqlite3_realloc(*(void **)(lVar1 + 0x28),(iRegion + 1) * 8);
    if (pvVar3 == (void *)0x0) {
      apNew._4_4_ = 0xc0a;
    }
    else {
      *(void **)(lVar1 + 0x28) = pvVar3;
      while ((int)(uint)*(ushort *)(lVar1 + 0x20) <= iRegion) {
        if (*(int *)(lVar1 + 0x18) < 0) {
          local_108 = sqlite3_malloc(szRegion);
          if (local_108 == (void *)0x0) {
            apNew._4_4_ = 7;
            break;
          }
          memset(local_108,0,(long)szRegion);
        }
        else {
          uVar4 = 3;
          if (*(char *)(lVar1 + 0x22) != '\0') {
            uVar4 = 1;
          }
          local_108 = (void *)(*aSyscall[0x15].pCurrent)
                                        (0,(long)szRegion,uVar4,1,(ulong)*(uint *)(lVar1 + 0x18),
                                         (long)szRegion * (ulong)*(ushort *)(lVar1 + 0x20));
          if (local_108 == (void *)0xffffffffffffffff) {
            apNew._4_4_ = unixLogErrorAtLine(0x150a,"mmap",*(char **)(lVar1 + 0x10),0x6b57);
            break;
          }
        }
        *(void **)(*(long *)(lVar1 + 0x28) + (ulong)*(ushort *)(lVar1 + 0x20) * 8) = local_108;
        *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      }
    }
  }
LAB_0013f701:
  if (iRegion < (int)(uint)*(ushort *)(lVar1 + 0x20)) {
    *pp = *(void **)(*(long *)(lVar1 + 0x28) + (long)iRegion * 8);
  }
  else {
    *pp = (void *)0x0;
  }
  if ((*(char *)(lVar1 + 0x22) != '\0') && (apNew._4_4_ == 0)) {
    apNew._4_4_ = 8;
  }
  sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar1 + 8));
  return apNew._4_4_;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  if( pShmNode->nRegion<=iRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = (iRegion+1)*szRegion;  /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, 0)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, (iRegion+1)*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while(pShmNode->nRegion<=iRegion){
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, szRegion,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }
      pShmNode->apRegion[pShmNode->nRegion] = pMem;
      pShmNode->nRegion++;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}